

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureCube
               (SurfaceAccess *dst,TextureCubeView *rawSrc,Vec4 *sq,Vec4 *tq,Vec4 *rq,
               ReferenceParams *params)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  float width;
  float height;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float z_;
  float local_1e0;
  float local_1c8;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vec4 local_188;
  float local_178;
  undefined1 local_174 [4];
  float lod;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 coord;
  float triNy;
  float triNx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  int px;
  int py;
  float lodBias;
  Vec3 triW [2];
  undefined1 local_108 [8];
  Vec3 triR [2];
  undefined1 local_e8 [8];
  Vec3 triT [2];
  undefined1 local_c8 [8];
  Vec3 triS [2];
  int srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  undefined1 local_88 [8];
  TextureCubeView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *params_local;
  Vec4 *rq_local;
  Vec4 *tq_local;
  Vec4 *sq_local;
  TextureCubeView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             (src.m_levels + 5));
  tcu::getEffectiveTextureView
            ((TextureCubeView *)local_88,rawSrc,
             (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             (src.m_levels + 5),&params->sampler);
  iVar1 = tcu::SurfaceAccess::getWidth(dst);
  iVar2 = tcu::SurfaceAccess::getHeight(dst);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar1,iVar2);
  iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  width = (float)iVar1;
  iVar1 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  height = (float)iVar1;
  iVar1 = tcu::TextureCubeView::getSize((TextureCubeView *)local_88);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_c8,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_e8,(int)tq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)tq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_108,(int)rq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)rq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&py,(int)params + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triW[0].m_data + 1),(int)params + 0xc,3,2);
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_1c8 = 0.0;
  }
  else {
    local_1c8 = (params->super_RenderParams).bias;
  }
  for (wx = 0.0; iVar2 = tcu::SurfaceAccess::getHeight(dst), (int)wx < iVar2;
      wx = (float)((int)wx + 1)) {
    for (wy = 0.0; iVar2 = tcu::SurfaceAccess::getWidth(dst), (int)wy < iVar2;
        wy = (float)((int)wy + 1)) {
      fVar4 = (float)(int)wy + 0.5;
      fVar5 = (float)(int)wx + 0.5;
      fVar6 = fVar4 / width;
      local_1e0 = fVar5 / height;
      uVar3 = (uint)(1.0 <= fVar6 + local_1e0);
      if (uVar3 != 0) {
        fVar6 = 1.0 - fVar6;
        local_1e0 = 1.0 - local_1e0;
      }
      fVar7 = triangleInterpolate((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),fVar6,local_1e0);
      fVar8 = triangleInterpolate((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),fVar6,local_1e0);
      z_ = triangleInterpolate((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),fVar6,local_1e0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordDx.m_data + 1),fVar7,fVar8,z_);
      fVar7 = triDerivateX((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar3 * 3),fVar4,width,local_1e0);
      fVar8 = triDerivateX((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar3 * 3),fVar4,width,local_1e0);
      fVar4 = triDerivateX((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar3 * 3),fVar4,width,local_1e0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordDy.m_data + 1),fVar7,fVar8,fVar4);
      fVar4 = triDerivateY((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar3 * 3),fVar5,height,fVar6);
      fVar7 = triDerivateY((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar3 * 3),fVar5,height,fVar6);
      fVar6 = triDerivateY((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar3 * 3),fVar5,height,fVar6);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_174,fVar4,fVar7,fVar6);
      fVar6 = computeCubeLodFromDerivates
                        (params->lodMode,(Vec3 *)(coordDx.m_data + 1),(Vec3 *)(coordDy.m_data + 1),
                         (Vec3 *)local_174,iVar1);
      local_178 = de::clamp<float>(fVar6 + local_1c8,params->minLod,params->maxLod);
      fVar6 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(coordDx.m_data + 1));
      fVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(coordDx.m_data + 1));
      fVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(coordDx.m_data + 1));
      execSample((TextureTestUtil *)&local_1a8,(TextureCubeView *)local_88,params,fVar6,fVar4,fVar5,
                 local_178);
      tcu::operator*((tcu *)&local_198,&local_1a8,&(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_188,&local_198,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_188,(int)wy,(int)wx);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             (src.m_levels + 5));
  return;
}

Assistant:

static void sampleTextureCube (const tcu::SurfaceAccess& dst, const tcu::TextureCubeView& rawSrc, const tcu::Vec4& sq, const tcu::Vec4& tq, const tcu::Vec4& rq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeView					src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	const tcu::IVec2							dstSize				= tcu::IVec2(dst.getWidth(), dst.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { params.w.swizzle(0, 1, 2), params.w.swizzle(3, 2, 1) };

	const float									lodBias				((params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f);

	for (int py = 0; py < dst.getHeight(); py++)
	{
		for (int px = 0; px < dst.getWidth(); px++)
		{
			const float		wx		= (float)px + 0.5f;
			const float		wy		= (float)py + 0.5f;
			const float		nx		= wx / dstW;
			const float		ny		= wy / dstH;

			const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
			const float		triNx	= triNdx ? 1.0f - nx : nx;
			const float		triNy	= triNdx ? 1.0f - ny : ny;

			const tcu::Vec3	coord		(triangleInterpolate(triS[triNdx], triNx, triNy),
										 triangleInterpolate(triT[triNdx], triNx, triNy),
										 triangleInterpolate(triR[triNdx], triNx, triNy));
			const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
										 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
										 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
			const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
										 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
										 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

			const float		lod			= de::clamp(computeCubeLodFromDerivates(params.lodMode, coord, coordDx, coordDy, srcSize) + lodBias, params.minLod, params.maxLod);

			dst.setPixel(execSample(src, params, coord.x(), coord.y(), coord.z(), lod) * params.colorScale + params.colorBias, px, py);
		}
	}
}